

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

Symbol * __thiscall
anon_unknown.dwarf_383094::InstanceBuilder::createInstance
          (InstanceBuilder *this,HierarchicalInstanceSyntax *syntax)

{
  int iVar1;
  InstanceSymbol *this_00;
  undefined4 extraout_var;
  Scope *scope;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> local_30;
  
  getNameLoc(&local_30,syntax);
  this_00 = slang::BumpAllocator::
            emplace<slang::ast::InstanceSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::Definition_const&,slang::ast::ParameterBuilder&,bool&>
                      (&this->compilation->super_BumpAllocator,this->compilation,&local_30.first,
                       &local_30.second,this->definition,this->paramBuilder,&this->isUninstantiated)
  ;
  iVar1 = slang::SmallVectorBase<int>::copy
                    (&(this->path).super_SmallVectorBase<int>,(EVP_PKEY_CTX *)this->compilation,src)
  ;
  (this_00->super_InstanceSymbolBase).arrayPath.data_ = (pointer)CONCAT44(extraout_var,iVar1);
  (this_00->super_InstanceSymbolBase).arrayPath.size_ = extraout_RDX;
  (this_00->super_InstanceSymbolBase).super_Symbol.originatingSyntax = &syntax->super_SyntaxNode;
  scope = slang::not_null<const_slang::ast::Scope_*>::get(&this->context->scope);
  slang::ast::Symbol::setAttributes((Symbol *)this_00,scope,this->attributes);
  return (Symbol *)this_00;
}

Assistant:

Symbol* createInstance(const HierarchicalInstanceSyntax& syntax) {
        auto [name, loc] = getNameLoc(syntax);
        auto inst = compilation.emplace<InstanceSymbol>(compilation, name, loc, definition,
                                                        paramBuilder, isUninstantiated);

        inst->arrayPath = path.copy(compilation);
        inst->setSyntax(syntax);
        inst->setAttributes(*context.scope, attributes);
        return inst;
    }